

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<70UL> *
mserialize::cx_strcat<9ul,2ul,58ul,1ul>
          (cx_string<9UL> *strings,cx_string<2UL> *strings_1,cx_string<58UL> *strings_2,
          cx_string<1UL> *strings_3)

{
  cx_string<58UL> *in_RCX;
  cx_string<2UL> *in_RDX;
  cx_string<9UL> *in_RSI;
  cx_string<70UL> *in_RDI;
  cx_string<1UL> *in_R8;
  size_t s;
  size_t i;
  char *out;
  size_t size [5];
  char *data [5];
  char buffer [71];
  char *in_stack_ffffffffffffff20;
  ulong local_d8;
  char *local_d0;
  size_t local_c0 [5];
  char *local_98;
  data_ref local_90;
  data_ref local_88;
  data_ref local_80;
  data_ref local_78;
  char local_68 [72];
  cx_string<1UL> *local_20;
  cx_string<58UL> *local_18;
  cx_string<2UL> *local_10;
  cx_string<9UL> *local_8;
  
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_68,0,0x47);
  local_98 = "";
  local_90 = cx_string<9UL>::data(local_8);
  local_88 = cx_string<2UL>::data(local_10);
  local_80 = cx_string<58UL>::data(local_18);
  local_78 = cx_string<1UL>::data(local_20);
  local_c0[0] = cx_string<9UL>::size(local_8);
  local_c0[1] = cx_string<2UL>::size(local_10);
  local_c0[2] = cx_string<58UL>::size(local_18);
  local_c0[3] = cx_string<1UL>::size(local_20);
  local_d0 = local_68;
  for (local_d8 = 1; local_d8 < 5; local_d8 = local_d8 + 1) {
    for (in_stack_ffffffffffffff20 = (char *)0x0;
        in_stack_ffffffffffffff20 < (cx_string<70UL> *)local_c0[local_d8 - 1];
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1) {
      *local_d0 = in_stack_ffffffffffffff20[(long)(&local_98)[local_d8]];
      local_d0 = local_d0 + 1;
    }
  }
  cx_string<70UL>::cx_string((cx_string<70UL> *)in_stack_ffffffffffffff20,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}